

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O0

void __thiscall Minisat::SimpSolver::removeClause(SimpSolver *this,CRef cr)

{
  int iVar1;
  Lit LVar2;
  Clause *this_00;
  vec<int> *this_01;
  int *piVar3;
  long in_RDI;
  bool in_stack_0000000b;
  CRef in_stack_0000000c;
  Solver *in_stack_00000010;
  int i;
  Clause *c;
  Ref in_stack_ffffffffffffffac;
  ClauseAllocator *in_stack_ffffffffffffffb0;
  int *in_stack_ffffffffffffffb8;
  Var v;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar4;
  undefined4 local_1c;
  
  this_00 = ClauseAllocator::operator[](in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  *(long *)(in_RDI + 0x200) = *(long *)(in_RDI + 0x200) + 1;
  if ((*(byte *)(in_RDI + 0x1430) & 1) != 0) {
    local_1c = 0;
    while( true ) {
      v = (Var)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
      iVar4 = local_1c;
      iVar1 = Clause::size(this_00);
      if (iVar1 <= iVar4) break;
      this_01 = (vec<int> *)(in_RDI + 0x1490);
      LVar2 = Clause::operator[](this_00,local_1c);
      iVar1 = toInt(LVar2);
      piVar3 = vec<int>::operator[](this_01,iVar1);
      *piVar3 = *piVar3 + -1;
      LVar2 = Clause::operator[](this_00,local_1c);
      var(LVar2);
      updateElimHeap((SimpSolver *)CONCAT44(iVar4,in_stack_ffffffffffffffc0),v);
      in_stack_ffffffffffffffb8 = (int *)(in_RDI + 0x1458);
      LVar2 = Clause::operator[](this_00,local_1c);
      var(LVar2);
      OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted>::smudge
                ((OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted> *)
                 CONCAT44(iVar4,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8);
      local_1c = local_1c + 1;
    }
  }
  Solver::removeClause(in_stack_00000010,in_stack_0000000c,in_stack_0000000b);
  return;
}

Assistant:

void SimpSolver::removeClause(CRef cr)
{
    const Clause &c = ca[cr];
    statistics.simpSteps++;

    if (use_simplification)
        for (int i = 0; i < c.size(); i++) {
            n_occ[toInt(c[i])]--;
            updateElimHeap(var(c[i]));
            occurs.smudge(var(c[i]));
        }

    Solver::removeClause(cr);
}